

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextmarkdownwriter.cpp
# Opt level: O0

int adjacentBackticksCount(QString *s)

{
  bool bVar1;
  int iVar2;
  qsizetype qVar3;
  int *piVar4;
  QString *in_RDI;
  long in_FS_OFFSET;
  int i;
  int len;
  int start;
  int ret;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar5;
  int iVar6;
  int local_1c;
  char16_t local_16;
  int local_14;
  char16_t local_e;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar6 = -1;
  qVar3 = QString::size(in_RDI);
  iVar2 = (int)qVar3;
  local_c = 0;
  for (iVar5 = 0; iVar5 < iVar2; iVar5 = iVar5 + 1) {
    local_e = (char16_t)QString::at(in_RDI,CONCAT44(iVar6,iVar2));
    bVar1 = operator==((QChar *)CONCAT44(iVar6,iVar2),
                       (QChar *)CONCAT44(iVar5,in_stack_ffffffffffffffc8));
    if (bVar1) {
      if (iVar6 < 0) {
        iVar6 = iVar5;
      }
    }
    else if (-1 < iVar6) {
      local_14 = iVar5 - iVar6;
      piVar4 = qMax<int>(&local_c,&local_14);
      local_c = *piVar4;
      iVar6 = -1;
    }
  }
  local_16 = (char16_t)QString::at(in_RDI,CONCAT44(iVar6,iVar2));
  bVar1 = operator==((QChar *)CONCAT44(iVar6,iVar2),
                     (QChar *)CONCAT44(iVar5,in_stack_ffffffffffffffc8));
  if (bVar1) {
    local_1c = iVar2 - iVar6;
    piVar4 = qMax<int>(&local_c,&local_1c);
    local_c = *piVar4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_c;
}

Assistant:

static int adjacentBackticksCount(const QString &s)
{
    int start = -1, len = s.size();
    int ret = 0;
    for (int i = 0; i < len; ++i) {
        if (s.at(i) == qtmw_Backtick) {
            if (start < 0)
                start = i;
        } else if (start >= 0) {
            ret = qMax(ret, i - start);
            start = -1;
        }
    }
    if (s.at(len - 1) == qtmw_Backtick)
        ret = qMax(ret, len - start);
    return ret;
}